

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O3

void __thiscall font2svg::ttf_file::ttf_file(ttf_file *this,string *fname)

{
  FT_Face_conflict *ppFVar1;
  char *pcVar2;
  FT_Error FVar3;
  size_t sVar4;
  ostream *poVar5;
  
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  FVar3 = FT_Init_FreeType(&this->library);
  this->error = FVar3;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(debug_abi_cxx11_ + 0x10),"Init error code: ",0x11);
  std::ostream::operator<<((ostream *)(debug_abi_cxx11_ + 0x10),this->error);
  ppFVar1 = &this->face;
  FVar3 = FT_New_Face(this->library,(this->filename)._M_dataplus._M_p,0,ppFVar1);
  this->error = FVar3;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(debug_abi_cxx11_ + 0x10),"\nFace load error code: ",0x17);
  std::ostream::operator<<((ostream *)(debug_abi_cxx11_ + 0x10),this->error);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(debug_abi_cxx11_ + 0x10),"\nfont filename: ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(debug_abi_cxx11_ + 0x10),(this->filename)._M_dataplus._M_p,
             (this->filename)._M_string_length);
  if (this->error == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(debug_abi_cxx11_ + 0x10),"\nFamily Name: ",0xe);
    pcVar2 = (*ppFVar1)->family_name;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(debug_abi_cxx11_._16_8_ + -0x18) + 0x10c1a8);
    }
    else {
      sVar4 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(debug_abi_cxx11_ + 0x10),pcVar2,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(debug_abi_cxx11_ + 0x10),"\nStyle Name: ",0xd);
    pcVar2 = (*ppFVar1)->style_name;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(debug_abi_cxx11_._16_8_ + -0x18) + 0x10c1a8);
    }
    else {
      sVar4 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(debug_abi_cxx11_ + 0x10),pcVar2,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(debug_abi_cxx11_ + 0x10),"\nNumber of faces: ",0x12);
    std::ostream::_M_insert<long>(0x10c1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(debug_abi_cxx11_ + 0x10),"\nNumber of glyphs: ",0x13);
    std::ostream::_M_insert<long>(0x10c1a8);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"problem loading file ",0x15);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(this->filename)._M_dataplus._M_p,
                      (this->filename)._M_string_length);
  std::operator<<(poVar5,"\n");
  exit(1);
}

Assistant:

ttf_file( std::string fname )
	{
		filename = fname;
		error = FT_Init_FreeType( &library );
		debug << "Init error code: " << error;

		// Load a typeface
		error = FT_New_Face( library, filename.c_str(), 0, &face );
		debug << "\nFace load error code: " << error;
		debug << "\nfont filename: " << filename;
		if (error) {
			std::cerr << "problem loading file " << filename << "\n";
			exit(1);
		}
		debug << "\nFamily Name: " << face->family_name;
		debug << "\nStyle Name: " << face->style_name;
		debug << "\nNumber of faces: " << face->num_faces;
		debug << "\nNumber of glyphs: " << face->num_glyphs;
	}